

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O1

void cie_lab(double *p)

{
  double dVar1;
  int j;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = xyz_whitepoint[2];
  dVar6 = xyz_whitepoint[0];
  dVar5 = 0.0;
  lVar2 = 0;
  dVar3 = 0.0;
  dVar7 = 0.0;
  do {
    dVar4 = p[lVar2];
    dVar5 = dVar5 + dVar4 * rgb_to_xyz[0][lVar2];
    dVar3 = dVar3 + dVar4 * rgb_to_xyz[1][lVar2];
    dVar7 = dVar7 + dVar4 * rgb_to_xyz[2][lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  dVar3 = dVar3 / xyz_whitepoint[1];
  if (dVar3 <= 0.008856451679035631) {
    dVar4 = dVar3 / 0.12841854934601665 + 0.13793103448275862;
  }
  else {
    dVar4 = cbrt(dVar3);
  }
  *p = dVar4 * 116.0 + -16.0;
  dVar5 = dVar5 / dVar6;
  if (dVar5 <= 0.008856451679035631) {
    dVar5 = dVar5 / 0.12841854934601665 + 0.13793103448275862;
  }
  else {
    dVar5 = cbrt(dVar5);
  }
  if (dVar3 <= 0.008856451679035631) {
    dVar6 = dVar3 / 0.12841854934601665 + 0.13793103448275862;
  }
  else {
    dVar6 = cbrt(dVar3);
  }
  p[1] = (dVar5 - dVar6) * 500.0;
  if (dVar3 <= 0.008856451679035631) {
    dVar5 = dVar3 / 0.12841854934601665 + 0.13793103448275862;
  }
  else {
    dVar5 = cbrt(dVar3);
  }
  dVar7 = dVar7 / dVar1;
  if (dVar7 <= 0.008856451679035631) {
    dVar3 = dVar7 / 0.12841854934601665 + 0.13793103448275862;
  }
  else {
    dVar3 = cbrt(dVar7);
  }
  p[2] = (dVar5 - dVar3) * 200.0;
  return;
}

Assistant:

void cie_lab(double *p) {
    double X = 0.0, Y = 0.0, Z = 0.0, Xw = xyz_whitepoint[0], Yw = xyz_whitepoint[1],
           Zw = xyz_whitepoint[2];

    for (int j = 0; j < 3; ++j) {
        X += p[j] * rgb_to_xyz[0][j];
        Y += p[j] * rgb_to_xyz[1][j];
        Z += p[j] * rgb_to_xyz[2][j];
    }

    auto f = [](double t) -> double {
        double delta = 6.0 / 29.0;
        if (t > delta * delta * delta)
            return cbrt(t);
        else
            return t / (delta * delta * 3.0) + (4.0 / 29.0);
    };

    p[0] = 116.0 * f(Y / Yw) - 16.0;
    p[1] = 500.0 * (f(X / Xw) - f(Y / Yw));
    p[2] = 200.0 * (f(Y / Yw) - f(Z / Zw));
}